

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
* fmt::v10::
  make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,unsigned_long>
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
            unsigned_long *args_1)

{
  longlong lVar1;
  size_t sVar2;
  longlong *in_RDX;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *in_RDI;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  undefined1 local_c9;
  char *local_c8;
  size_t local_c0;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  char *local_a8 [6];
  undefined1 *local_78;
  basic_string_view<char> local_70;
  char **local_60;
  basic_string_view<char> local_58 [2];
  size_t local_30;
  
  local_b1 = 1;
  local_b2 = 1;
  local_b3 = 1;
  local_78 = &local_c9;
  local_70 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x2dc9cb);
  local_c8 = local_70.data_;
  local_c0 = local_70.size_;
  local_58[0].data_ = local_70.data_;
  local_58[0].size_ = local_70.size_;
  local_60 = local_a8;
  local_a8[0] = basic_string_view<char>::data(local_58);
  sVar2 = basic_string_view<char>::size(local_58);
  lVar1 = *in_RDX;
  (in_RDI->data_).args_[0].field_0.string.data = local_a8[0];
  (in_RDI->data_).args_[0].field_0.string.size = sVar2;
  (in_RDI->data_).args_[1].field_0.long_long_value = lVar1;
  (in_RDI->data_).args_[1].field_0.string.size = local_30;
  return in_RDI;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}